

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MultipleBindingCase::createBuffers
          (MultipleBindingCase *this)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  int iVar9;
  deUint32 dVar10;
  undefined4 extraout_var;
  float *pfVar12;
  pointer pVVar13;
  byte bVar14;
  int y;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  float *pfVar19;
  pointer pVVar20;
  int x;
  long lVar21;
  Vec4 *color;
  undefined8 *puVar22;
  long lVar23;
  size_type __n;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> primitiveData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorOffsetData;
  allocator_type local_69;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_68;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_50;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  long lVar11;
  
  iVar9 = (*((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar9);
  local_38 = 0x3f80000000000000;
  uStack_30 = 0x3f80000000000000;
  local_28 = 0x3f8000003f800000;
  uStack_20 = 0x3f80000000000000;
  bVar3 = (this->m_spec).instanced;
  uVar17 = 0x12c0;
  if (bVar3 != false) {
    uVar17 = 800;
  }
  uVar16 = 2;
  if ((this->m_spec).zeroStride == false) {
    uVar16 = (ulong)uVar17;
  }
  bVar4 = (this->m_spec).aliasingBuffers;
  uVar18 = 0;
  if (bVar4 != false) {
    uVar18 = uVar16;
  }
  uVar17 = (int)uVar18 + 0x960;
  if (bVar3 != false) {
    uVar17 = (int)uVar18 + 6;
  }
  __n = 0;
  if (bVar4 == false) {
    __n = uVar16;
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_68,(ulong)uVar17,(allocator_type *)&local_50);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_50,__n,&local_69);
  if ((this->m_spec).aliasingBuffers == true) {
    bVar14 = (this->m_spec).instanced;
    if ((bool)bVar14 == true) {
      pVVar13 = local_68.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start + 6;
    }
    else {
      pVVar13 = local_68.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start + 0x960;
    }
  }
  else {
    bVar14 = (this->m_spec).instanced;
    pVVar13 = local_50.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  if ((bVar14 & 1) == 0) {
    lVar15 = 0;
    lVar21 = 0;
    do {
      fVar24 = (float)(int)lVar21 / 20.0;
      fVar24 = fVar24 + fVar24 + -1.0;
      lVar21 = lVar21 + 1;
      fVar25 = (float)(int)lVar21 / 20.0;
      fVar25 = fVar25 + fVar25 + -1.0;
      iVar9 = 0;
      lVar23 = 0;
      do {
        fVar26 = (float)iVar9 / 20.0 + (float)iVar9 / 20.0 + -1.0;
        *(float *)((long)(local_68.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar23 + lVar15) =
             fVar26;
        *(float *)((long)(local_68.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar23 + 4 + lVar15)
             = fVar24;
        *(undefined8 *)
         ((long)(local_68.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_data + lVar23 + 8 + lVar15) =
             0x3f80000000000000;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar15 + lVar23) =
             fVar26;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar23 + lVar15 + 4)
             = fVar25;
        *(undefined8 *)
         ((long)local_68.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[1].m_data + lVar23 + lVar15 + 8) =
             0x3f80000000000000;
        iVar9 = iVar9 + 1;
        fVar27 = (float)iVar9 / 20.0 + (float)iVar9 / 20.0 + -1.0;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar15 + lVar23) =
             fVar27;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar23 + lVar15 + 4)
             = fVar25;
        *(undefined8 *)
         ((long)local_68.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[2].m_data + lVar23 + lVar15 + 8) =
             0x3f80000000000000;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar15 + lVar23) =
             fVar26;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar23 + lVar15 + 4)
             = fVar24;
        *(undefined8 *)
         ((long)local_68.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[3].m_data + lVar23 + lVar15 + 8) =
             0x3f80000000000000;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar15 + lVar23) =
             fVar27;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar23 + lVar15 + 4)
             = fVar25;
        *(undefined8 *)
         ((long)local_68.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[4].m_data + lVar23 + lVar15 + 8) =
             0x3f80000000000000;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[5].m_data + lVar15 + lVar23) =
             fVar27;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[5].m_data + lVar23 + lVar15 + 4)
             = fVar24;
        *(undefined8 *)
         ((long)local_68.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[5].m_data + lVar23 + lVar15 + 8) =
             0x3f80000000000000;
        lVar23 = lVar23 + 0x60;
      } while (lVar23 != 0x780);
      lVar15 = lVar15 + 0x780;
    } while (lVar21 != 0x14);
  }
  else {
    (local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
     _M_impl.super__Vector_impl_data._M_start)->m_data[0] = 0.0;
    (local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
     _M_impl.super__Vector_impl_data._M_start)->m_data[1] = 0.0;
    (local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
     _M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.0;
    (local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
     _M_impl.super__Vector_impl_data._M_start)->m_data[3] = 1.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[1].m_data[0] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[1].m_data[1] = 0.1;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 1.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[2].m_data[0] = 0.1;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[2].m_data[1] = 0.1;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 1.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[3].m_data[0] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[3].m_data[1] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[3].m_data[2] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[3].m_data[3] = 1.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[4].m_data[0] = 0.1;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[4].m_data[1] = 0.1;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[4].m_data[2] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[4].m_data[3] = 1.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[5].m_data[0] = 0.1;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[5].m_data[1] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[5].m_data[2] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[5].m_data[3] = 1.0;
  }
  if ((this->m_spec).zeroStride == true) {
    *(undefined8 *)pVVar13->m_data = local_38;
    *(undefined8 *)(pVVar13->m_data + 2) = uStack_30;
    pVVar13[1].m_data[0] = 0.0;
    pVVar13[1].m_data[1] = 0.0;
    pVVar13[1].m_data[2] = 0.0;
    pVVar13[1].m_data[3] = 0.0;
  }
  else if ((this->m_spec).instanced == false) {
    lVar15 = 0;
    do {
      lVar21 = 0;
      pVVar20 = pVVar13;
      do {
        puVar22 = &local_28;
        if (((int)lVar21 + (int)lVar15 & 1U) == 0) {
          puVar22 = &local_38;
        }
        lVar23 = 0x10;
        do {
          uVar5 = *(undefined4 *)((long)puVar22 + 4);
          uVar6 = *(undefined4 *)(puVar22 + 1);
          uVar7 = *(undefined4 *)((long)puVar22 + 0xc);
          puVar2 = (undefined4 *)((long)pVVar20[-1].m_data + lVar23);
          *puVar2 = *(undefined4 *)puVar22;
          puVar2[1] = uVar5;
          puVar2[2] = uVar6;
          puVar2[3] = uVar7;
          puVar1 = (undefined8 *)((long)pVVar20->m_data + lVar23);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar23 = lVar23 + 0x20;
        } while (lVar23 != 0xd0);
        lVar21 = lVar21 + 1;
        pVVar20 = pVVar20 + 0xc;
      } while (lVar21 != 0x14);
      lVar15 = lVar15 + 1;
      pVVar13 = pVVar13 + 0xf0;
    } while (lVar15 != 0x14);
  }
  else {
    pfVar12 = pVVar13[1].m_data + 2;
    lVar15 = 0;
    do {
      fVar24 = (float)(int)lVar15 / 20.0;
      lVar21 = 0;
      pfVar19 = pfVar12;
      do {
        puVar22 = &local_28;
        if (((int)lVar15 + (int)lVar21 & 1U) == 0) {
          puVar22 = &local_38;
        }
        uVar8 = puVar22[1];
        *(undefined8 *)(pfVar19 + -6) = *puVar22;
        *(undefined8 *)(pfVar19 + -4) = uVar8;
        fVar25 = (float)(int)lVar21 / 20.0;
        ((Vector<float,_4> *)(pfVar19 + -2))->m_data[0] = fVar25 + fVar25 + -1.0;
        pfVar19[-1] = fVar24 + fVar24 + -1.0;
        pfVar19[0] = 0.0;
        pfVar19[1] = 0.0;
        lVar21 = lVar21 + 1;
        pfVar19 = pfVar19 + 8;
      } while (lVar21 != 0x14);
      lVar15 = lVar15 + 1;
      pfVar12 = pfVar12 + 0xa0;
    } while (lVar15 != 0x14);
  }
  (**(code **)(lVar11 + 0x6c8))(1,&this->m_primitiveBuf);
  (**(code **)(lVar11 + 0x40))(0x8892,this->m_primitiveBuf);
  (**(code **)(lVar11 + 0x150))
            (0x8892,(long)((int)local_68.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (int)local_68.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
             local_68.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  dVar10 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar10,"upload data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x31c);
  if ((this->m_spec).aliasingBuffers == false) {
    (**(code **)(lVar11 + 0x6c8))(1,&this->m_colorOffsetBuf);
    (**(code **)(lVar11 + 0x40))(0x8892,this->m_colorOffsetBuf);
    (**(code **)(lVar11 + 0x150))
              (0x8892,(long)((int)local_50.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (int)local_50.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
               local_50.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e4);
    dVar10 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar10,"upload colordata",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x325);
  }
  if (local_50.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MultipleBindingCase::createBuffers (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const tcu::Vec4			green				= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4			yellow				= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);

	const int				vertexDataSize		= (m_spec.instanced) ? (6) : (6 * GRID_SIZE * GRID_SIZE);
	const int				offsetColorSize		= (m_spec.zeroStride) ? (2) : (m_spec.instanced) ? (2 * GRID_SIZE * GRID_SIZE) : (2 * 6 * GRID_SIZE * GRID_SIZE);
	const int				primitiveBufSize	= (m_spec.aliasingBuffers) ? (vertexDataSize + offsetColorSize) : (vertexDataSize);
	const int				colorOffsetBufSize	= (m_spec.aliasingBuffers) ? (0) : (offsetColorSize);

	std::vector<tcu::Vec4>	primitiveData		(primitiveBufSize);
	std::vector<tcu::Vec4>	colorOffsetData		(colorOffsetBufSize);
	tcu::Vec4*				colorOffsetWritePtr = DE_NULL;

	if (m_spec.aliasingBuffers)
	{
		if (m_spec.instanced)
			colorOffsetWritePtr = &primitiveData[6];
		else
			colorOffsetWritePtr = &primitiveData[GRID_SIZE*GRID_SIZE*6];
	}
	else
		colorOffsetWritePtr = &colorOffsetData[0];

	// write vertex position

	if (m_spec.instanced)
	{
		// store single basic primitive
		primitiveData[0] = tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		primitiveData[1] = tcu::Vec4(0.0f,				2.0f / GRID_SIZE,	0.0f, 1.0f);
		primitiveData[2] = tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		primitiveData[3] = tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		primitiveData[4] = tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		primitiveData[5] = tcu::Vec4(2.0f / GRID_SIZE,	0.0f,				0.0f, 1.0f);
	}
	else
	{
		// store whole grid
		for (int y = 0; y < GRID_SIZE; ++y)
		for (int x = 0; x < GRID_SIZE; ++x)
		{
			primitiveData[(y * GRID_SIZE + x) * 6 + 0] = tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 1] = tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 2] = tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 3] = tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 4] = tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 5] = tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
		}
	}

	// store color&offset

	if (m_spec.zeroStride)
	{
		colorOffsetWritePtr[0] = green;
		colorOffsetWritePtr[1] = tcu::Vec4(0.0f);
	}
	else if (m_spec.instanced)
	{
		for (int y = 0; y < GRID_SIZE; ++y)
		for (int x = 0; x < GRID_SIZE; ++x)
		{
			const tcu::Vec4& color = ((x + y) % 2 == 0) ? (green) : (yellow);

			colorOffsetWritePtr[(y * GRID_SIZE + x) * 2 + 0] = color;
			colorOffsetWritePtr[(y * GRID_SIZE + x) * 2 + 1] = tcu::Vec4(float(x) / float(GRID_SIZE) * 2.0f - 1.0f, float(y) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 0.0f);
		}
	}
	else
	{
		for (int y = 0; y < GRID_SIZE; ++y)
		for (int x = 0; x < GRID_SIZE; ++x)
		for (int v = 0; v < 6; ++v)
		{
			const tcu::Vec4& color = ((x + y) % 2 == 0) ? (green) : (yellow);

			colorOffsetWritePtr[((y * GRID_SIZE + x) * 6 + v) * 2 + 0] = color;
			colorOffsetWritePtr[((y * GRID_SIZE + x) * 6 + v) * 2 + 1] = tcu::Vec4(0.0f);
		}
	}

	// upload vertex data

	gl.genBuffers(1, &m_primitiveBuf);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_primitiveBuf);
	gl.bufferData(GL_ARRAY_BUFFER, (int)(primitiveData.size() * sizeof(tcu::Vec4)), primitiveData[0].getPtr(), GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "upload data");

	if (!m_spec.aliasingBuffers)
	{
		// upload color & offset data

		gl.genBuffers(1, &m_colorOffsetBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_colorOffsetBuf);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(colorOffsetData.size() * sizeof(tcu::Vec4)), colorOffsetData[0].getPtr(), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "upload colordata");
	}
}